

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  int in_stack_fffffffffffffe88;
  stbi__result_info local_114;
  stbi__context s;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  psVar1 = (stbi_uc *)stbi__load_main(&s,x,y,comp,req_comp,&local_114,in_stack_fffffffffffffe88);
  if (psVar1 == (stbi_uc *)0x0) {
    psVar1 = (stbi_uc *)0x0;
  }
  else if (local_114.bits_per_channel != 8) {
    if (req_comp == 0) {
      req_comp = *comp;
    }
    uVar4 = *y * *x * req_comp;
    psVar2 = (stbi_uc *)stbi__malloc((long)(int)uVar4);
    if (psVar2 == (stbi_uc *)0x0) {
      in_FS_OFFSET[-0x81] = (long)"outofmem";
      psVar1 = psVar2;
    }
    else {
      uVar3 = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar3;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        psVar2[uVar3] = psVar1[uVar3 * 2 + 1];
      }
      (*(code *)in_FS_OFFSET[-0x85])(*in_FS_OFFSET + -0x430,3);
      psVar1 = psVar2;
    }
  }
  return psVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}